

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ggml-backend.cpp
# Opt level: O2

_Bool ggml_backend_sched_buffer_supported(ggml_backend_sched_t sched,ggml_tensor *t,int backend_id)

{
  int *piVar1;
  ggml_backend_dev_t pgVar2;
  _Bool _Var3;
  int iVar4;
  ggml_tensor *pgVar5;
  size_t sVar6;
  ggml_backend_buffer_type_t *ppgVar7;
  
  pgVar5 = t->view_src;
  if (t->view_src == (ggml_tensor *)0x0) {
    pgVar5 = t;
  }
  if (pgVar5->buffer == (ggml_backend_buffer *)0x0) {
    piVar1 = sched->hv_tensor_backend_ids;
    sVar6 = ggml_hash_find_or_insert(&sched->hash_set,t);
    iVar4 = piVar1[sVar6];
    if (iVar4 == -1) {
      if (t->view_src == (ggml_tensor *)0x0) {
        return false;
      }
      piVar1 = sched->hv_tensor_backend_ids;
      sVar6 = ggml_hash_find_or_insert(&sched->hash_set,t->view_src);
      iVar4 = piVar1[sVar6];
      if (iVar4 == -1) {
        return false;
      }
    }
    ppgVar7 = sched->bufts + iVar4;
  }
  else {
    ppgVar7 = &pgVar5->buffer->buft;
  }
  if (*ppgVar7 == (ggml_backend_buffer_type_t)0x0) {
    return false;
  }
  pgVar2 = sched->backends[backend_id]->device;
  _Var3 = (*(pgVar2->iface).supports_buft)(pgVar2,*ppgVar7);
  return _Var3;
}

Assistant:

static bool ggml_backend_sched_buffer_supported(ggml_backend_sched_t sched, struct ggml_tensor * t, int backend_id) {
    ggml_backend_buffer_t buf = t->view_src ? t->view_src->buffer : t->buffer;
    ggml_backend_buffer_type_t buft = NULL;

    if (buf) {
        // the tensor is already allocated
        buft = buf->buft;
    } else {
        // see if the tensor already has a backend assigned, and use the buffer type of that backend
        int tensor_backend_id = tensor_backend_id(t);
        if (tensor_backend_id == -1 && t->view_src) {
            tensor_backend_id = tensor_backend_id(t->view_src);
        }
        if (tensor_backend_id != -1) {
            buft = sched->bufts[tensor_backend_id];
        }
    }

    return buft != NULL && ggml_backend_supports_buft(sched->backends[backend_id], buft);
}